

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshkdf.c
# Opt level: O0

int kdf_sshkdf_derive(void *vctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  int iVar1;
  EVP_MD *pEVar2;
  long in_RDI;
  uchar *unaff_retaddr;
  size_t in_stack_00000008;
  uchar *in_stack_00000010;
  size_t in_stack_00000018;
  uchar *in_stack_00000020;
  EVP_MD *md;
  KDF_SSHKDF *ctx;
  size_t in_stack_00000058;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  OSSL_PARAM *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) ||
     (iVar1 = kdf_sshkdf_set_ctx_params(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0),
     iVar1 == 0)) {
    return 0;
  }
  pEVar2 = ossl_prov_digest_md((PROV_DIGEST *)(in_RDI + 8));
  if (pEVar2 == (EVP_MD *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x39,0x81,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x20) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x39,0x80,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x30) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x39,0x87,(char *)0x0);
    return 0;
  }
  if (*(long *)(in_RDI + 0x48) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x39,0x85,(char *)0x0);
    return 0;
  }
  if (*(char *)(in_RDI + 0x40) == '\0') {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffb0,line,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x39,0x86,(char *)0x0);
    return 0;
  }
  iVar1 = SSHKDF(md,in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                 unaff_retaddr,keylen,(char)key,(uchar *)vctx,in_stack_00000058);
  return iVar1;
}

Assistant:

static int kdf_sshkdf_derive(void *vctx, unsigned char *key, size_t keylen,
                             const OSSL_PARAM params[])
{
    KDF_SSHKDF *ctx = (KDF_SSHKDF *)vctx;
    const EVP_MD *md;

    if (!ossl_prov_is_running() || !kdf_sshkdf_set_ctx_params(ctx, params))
        return 0;

    md = ossl_prov_digest_md(&ctx->digest);
    if (md == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_MESSAGE_DIGEST);
        return 0;
    }
    if (ctx->key == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_KEY);
        return 0;
    }
    if (ctx->xcghash == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_XCGHASH);
        return 0;
    }
    if (ctx->session_id == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_SESSION_ID);
        return 0;
    }
    if (ctx->type == 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_TYPE);
        return 0;
    }
    return SSHKDF(md, ctx->key, ctx->key_len,
                  ctx->xcghash, ctx->xcghash_len,
                  ctx->session_id, ctx->session_id_len,
                  ctx->type, key, keylen);
}